

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O0

uint32 __thiscall Clasp::SolverParams::prepare(SolverParams *this)

{
  bool bVar1;
  SolverStrategies *in_RDI;
  uint32 res;
  uint local_c;
  
  local_c = 0;
  if (((SUB84(*in_RDI,4) >> 0x13 & 1) == 1) &&
     (bVar1 = Heuristic_t::isLookback(SUB84(*in_RDI,4) & 7), bVar1)) {
    *in_RDI = (SolverStrategies)((ulong)*in_RDI & 0xfffffff8ffffffff | 0x600000000);
    local_c = 1;
  }
  if ((SUB84(*in_RDI,4) & 7) == 5) {
    bVar1 = Lookahead::isType(*(uint *)(in_RDI + 3) >> 0x10 & 3);
    if (!bVar1) {
      local_c = local_c | 2;
      *(uint *)(in_RDI + 3) = *(uint *)(in_RDI + 3) & 0xfffcffff | 0x10000;
    }
    *(uint *)(in_RDI + 3) = *(uint *)(in_RDI + 3) & 0xffff0000;
  }
  if (((SUB84(*in_RDI,4) & 7) != 4) &&
     (((*(uint *)(in_RDI + 1) >> 0x18 & 0x1f) != 0 || (*(uint *)(in_RDI + 1) >> 0x1d != 0)))) {
    local_c = local_c | 4;
    *(uint *)(in_RDI + 1) = *(uint *)(in_RDI + 1) & 0xe0ffffff;
    *(uint *)(in_RDI + 1) = *(uint *)(in_RDI + 1) & 0x1fffffff;
  }
  SolverStrategies::prepare(in_RDI);
  return local_c;
}

Assistant:

uint32 SolverParams::prepare() {
	uint32 res = 0;
	if (search == SolverStrategies::no_learning && Heuristic_t::isLookback(heuId)) {
		heuId = Heuristic_t::None;
		res  |= 1;
	}
	if (heuId == Heuristic_t::Unit) {
		if (!Lookahead::isType(lookType)) { res |= 2; lookType = Var_t::Atom; }
		lookOps = 0;
	}
	if (heuId != Heuristic_t::Domain && (heuristic.domPref || heuristic.domMod)) {
		res |= 4;
		heuristic.domPref= 0;
		heuristic.domMod = 0;
	}
	SolverStrategies::prepare();
	return res;
}